

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::DefaultFieldComparator::CompareDoubleOrFloat<double>
          (DefaultFieldComparator *this,FieldDescriptor *field,double value_1,double value_2)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  _Base_ptr p_Var3;
  Tolerance *pTVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  
  bVar6 = true;
  if ((value_1 != value_2) || (NAN(value_1) || NAN(value_2))) {
    bVar6 = this->float_comparison_ != EXACT;
    bVar2 = (NAN(value_2) && NAN(value_1)) & this->treat_nan_as_equal_;
    if (bVar6 && bVar2 == 0) {
      p_Var1 = &(this->map_tolerance_)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (this->map_tolerance_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 = &p_Var1->_M_header;
      for (; p_Var5 != (_Base_ptr)0x0;
          p_Var5 = (&p_Var5->_M_left)[*(FieldDescriptor **)(p_Var5 + 1) < field]) {
        if (*(FieldDescriptor **)(p_Var5 + 1) >= field) {
          p_Var3 = p_Var5;
        }
      }
      p_Var5 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
         (p_Var5 = p_Var3, field < *(FieldDescriptor **)(p_Var3 + 1))) {
        p_Var5 = &p_Var1->_M_header;
      }
      pTVar4 = (Tolerance *)0x0;
      if ((this->has_default_tolerance_ & 1U) != 0) {
        pTVar4 = &this->default_tolerance_;
      }
      if ((_Rb_tree_header *)p_Var5 != p_Var1) {
        pTVar4 = (Tolerance *)&p_Var5[1]._M_parent;
      }
      if (pTVar4 != (Tolerance *)0x0) {
        bVar6 = MathUtil::WithinFractionOrMargin<double>
                          (value_1,value_2,(double)pTVar4->fraction,(double)pTVar4->margin);
        return bVar6;
      }
      bVar6 = ABS(value_1 - value_2) < 7.105427357601002e-15;
    }
    else {
      bVar6 = (bool)(bVar6 | bVar2);
    }
  }
  return bVar6;
}

Assistant:

bool DefaultFieldComparator::CompareDoubleOrFloat(const FieldDescriptor& field,
                                                  T value_1, T value_2) {
  if (value_1 == value_2) {
    // Covers +inf and -inf (which are not within margin or fraction of
    // themselves), and is a shortcut for finite values.
    return true;
  } else if (float_comparison_ == EXACT) {
    if (treat_nan_as_equal_ && std::isnan(value_1) && std::isnan(value_2)) {
      return true;
    }
    return false;
  } else {
    if (treat_nan_as_equal_ && std::isnan(value_1) && std::isnan(value_2)) {
      return true;
    }
    // float_comparison_ == APPROXIMATE covers two use cases.
    Tolerance* tolerance = FindOrNull(map_tolerance_, &field);
    if (tolerance == NULL && has_default_tolerance_) {
      tolerance = &default_tolerance_;
    }
    if (tolerance == NULL) {
      return MathUtil::AlmostEquals(value_1, value_2);
    } else {
      // Use user-provided fraction and margin. Since they are stored as
      // doubles, we explicitly cast them to types of values provided. This
      // is very likely to fail if provided values are not numeric.
      return MathUtil::WithinFractionOrMargin(
          value_1, value_2, static_cast<T>(tolerance->fraction),
          static_cast<T>(tolerance->margin));
    }
  }
}